

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QStyleOptionGraphicsItem>::copyAppend
          (QGenericArrayOps<QStyleOptionGraphicsItem> *this,QStyleOptionGraphicsItem *b,
          QStyleOptionGraphicsItem *e)

{
  qreal *pqVar1;
  QStyleOptionGraphicsItem *pQVar2;
  qreal qVar3;
  qreal qVar4;
  qreal qVar5;
  long lVar6;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QStyleOptionGraphicsItem>).ptr;
    lVar6 = (this->super_QArrayDataPointer<QStyleOptionGraphicsItem>).size;
    do {
      QStyleOption::QStyleOption(&pQVar2[lVar6].super_QStyleOption,1,0xf);
      pqVar1 = &pQVar2[lVar6].exposedRect.w;
      *pqVar1 = 0.0;
      pqVar1[1] = 0.0;
      pQVar2[lVar6].exposedRect.xp = 0.0;
      pQVar2[lVar6].exposedRect.yp = 0.0;
      QStyleOption::operator=(&pQVar2[lVar6].super_QStyleOption,&b->super_QStyleOption);
      qVar3 = (b->exposedRect).yp;
      qVar4 = (b->exposedRect).w;
      qVar5 = (b->exposedRect).h;
      pQVar2[lVar6].exposedRect.xp = (b->exposedRect).xp;
      pQVar2[lVar6].exposedRect.yp = qVar3;
      pqVar1 = &pQVar2[lVar6].exposedRect.w;
      *pqVar1 = qVar4;
      pqVar1[1] = qVar5;
      b = b + 1;
      lVar6 = (this->super_QArrayDataPointer<QStyleOptionGraphicsItem>).size + 1;
      (this->super_QArrayDataPointer<QStyleOptionGraphicsItem>).size = lVar6;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }